

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O3

void __thiscall InputParser::InputParser(InputParser *this,istream *in)

{
  size_t in_RCX;
  void *in_RDX;
  
  this->stream = in;
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  this->good = true;
  this->lineno = 0;
  this->oldLineno = 1;
  read(this,(int)in,in_RDX,in_RCX);
  return;
}

Assistant:

InputParser::InputParser(std::istream& in)
    : stream(in), good(true), lineno(0), oldLineno(1)
{
    read();
}